

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O0

double __thiscall
spdlog::sinks::stdout_sink_base<spdlog::details::console_mutex>::log
          (stdout_sink_base<spdlog::details::console_mutex> *this,double __x)

{
  pointer pfVar1;
  char *ptr;
  undefined8 in_RSI;
  double extraout_XMM0_Qa;
  memory_buf_t formatted;
  lock_guard<std::mutex> lock;
  allocator<char> *in_stack_fffffffffffffe98;
  buffer<char> *this_00;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffea0;
  buffer<char> local_138 [9];
  undefined8 local_10;
  stdout_sink_base<spdlog::details::console_mutex> *local_8;
  
  local_10 = in_RSI;
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffea0,
             (mutex_type *)in_stack_fffffffffffffe98);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x283174);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,local_138);
  this_00 = local_138;
  ptr = ::fmt::v11::detail::buffer<char>::data(this_00);
  ::fmt::v11::detail::buffer<char>::size(this_00);
  details::os::fwrite_bytes(ptr,(size_t)this_00,(FILE *)0x2831c1);
  fflush((FILE *)this->file_);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x2831dd);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2831ea);
  return extraout_XMM0_Qa;
}

Assistant:

SPDLOG_INLINE void stdout_sink_base<ConsoleMutex>::log(const details::log_msg &msg) {
#ifdef _WIN32
    if (handle_ == INVALID_HANDLE_VALUE) {
        return;
    }
    std::lock_guard<mutex_t> lock(mutex_);
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    auto size = static_cast<DWORD>(formatted.size());
    DWORD bytes_written = 0;
    bool ok = ::WriteFile(handle_, formatted.data(), size, &bytes_written, nullptr) != 0;
    if (!ok) {
        throw_spdlog_ex("stdout_sink_base: WriteFile() failed. GetLastError(): " +
                        std::to_string(::GetLastError()));
    }
#else
    std::lock_guard<mutex_t> lock(mutex_);
    memory_buf_t formatted;
    formatter_->format(msg, formatted);
    details::os::fwrite_bytes(formatted.data(), formatted.size(), file_);
#endif                // _WIN32
    ::fflush(file_);  // flush every line to terminal
}